

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O0

void my_canvas_size(t_my_canvas *x,t_symbol *s,int ac,t_atom *av)

{
  t_float tVar1;
  int local_2c;
  int i;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  t_my_canvas *x_local;
  
  tVar1 = atom_getfloatarg(0,ac,av);
  local_2c = (int)tVar1;
  if (local_2c < 1) {
    local_2c = 1;
  }
  (x->x_gui).x_w = local_2c * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_h = (x->x_gui).x_w;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_canvas_size(t_my_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    int i = atom_getfloatarg(0, ac, av);

    if(i < 1)
        i = 1;
    x->x_gui.x_w = i*IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    iemgui_size((void *)x, &x->x_gui);
}